

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O0

void __thiscall
CChromeTracer::addCallLogging
          (CChromeTracer *this,char *name,uint64_t threadId,uint64_t startTime,uint64_t delta)

{
  reference pvVar1;
  uint64_t in_RCX;
  uint64_t in_RDX;
  CChromeTracer *in_RDI;
  uint64_t in_R8;
  Record *rec;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  RecordType *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  CChromeTracer *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffa8);
  if (in_RDI->m_BufferSize == 0) {
    writeCallLogging(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (uint64_t)in_stack_ffffffffffffffb8,(uint64_t)in_RDI);
  }
  else {
    std::vector<CChromeTracer::Record,std::allocator<CChromeTracer::Record>>::
    emplace_back<CChromeTracer::RecordType,char_const*&>
              ((vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_> *)
               ((ulong)in_stack_ffffffffffffffc4 << 0x20),in_stack_ffffffffffffffb8,(char **)in_RDI)
    ;
    pvVar1 = std::vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>::back
                       ((vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_> *)
                        in_RDI);
    (pvVar1->field_3).CallLogging.ThreadId = in_RDX;
    (pvVar1->field_3).CallLogging.StartTime = in_RCX;
    (pvVar1->field_3).CallLogging.Delta = in_R8;
    checkFlushRecords(in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22b5db);
  return;
}

Assistant:

void addCallLogging(
            const char* name,
            uint64_t threadId,
            uint64_t startTime,
            uint64_t delta )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        if( m_BufferSize == 0 )
        {
            writeCallLogging(
                name,
                threadId,
                startTime,
                delta );
        }
        else
        {
            m_RecordBuffer.emplace_back(RecordType::CallLogging, name);

            Record& rec = m_RecordBuffer.back();
            rec.CallLogging.ThreadId = threadId;
            rec.CallLogging.StartTime = startTime;
            rec.CallLogging.Delta = delta;

            checkFlushRecords();
        }
    }